

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

int Ivy_TruthDsd(uint uTruth,Vec_Int_t *vTree)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  vTree->nSize = 0;
  iVar2 = 5;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    Vec_IntPush(vTree,0);
  }
  if (uTruth == 0) {
    iVar2 = 0x11;
LAB_0064292e:
    Vec_IntPush(vTree,iVar2);
    return 1;
  }
  if (uTruth == 0xffffffff) {
    iVar2 = 1;
    goto LAB_0064292e;
  }
  uVar1 = Ivy_TruthDecompose_rec(uTruth,vTree);
  if (uVar1 == 0xffffffff) {
    return 0;
  }
  if ((int)uVar1 < 10) {
    uVar1 = (uVar1 & 0xe) * 0x100 + (uVar1 & 1) * 0x10 + 2;
  }
  else {
    if ((uVar1 & 1) == 0) goto LAB_00642997;
    if (vTree->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    uVar1 = vTree->nSize - 1;
    vTree->nSize = uVar1;
    if ((vTree->pArray[uVar1] & 0x10U) != 0) {
      __assert_fail("Node.fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,199,"int Ivy_TruthDsd(unsigned int, Vec_Int_t *)");
    }
    uVar1 = vTree->pArray[uVar1] | 0x10;
  }
  Vec_IntPush(vTree,uVar1);
LAB_00642997:
  uVar1 = Ivy_TruthDsdCompute(vTree);
  if (uVar1 == uTruth) {
    return 1;
  }
  puts("Verification failed.");
  return 1;
}

Assistant:

int Ivy_TruthDsd( unsigned uTruth, Vec_Int_t * vTree )
{
    Ivy_Dec_t Node;
    int i, RetValue;
    // set the PI variables
    Vec_IntClear( vTree );
    for ( i = 0; i < 5; i++ )
        Vec_IntPush( vTree, 0 );
    // check if it is a constant
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Ivy_DecClear( &Node );
        Node.Type = IVY_DEC_CONST1;
        Node.fCompl = (uTruth == 0);
        Vec_IntPush( vTree, Ivy_DecToInt(Node) );
        return 1;
    }
    // perform the decomposition
    RetValue = Ivy_TruthDecompose_rec( uTruth, vTree );
    if ( RetValue == -1 )
        return 0;
    // get the topmost node
    if ( (RetValue >> 1) < 5 )
    { // add buffer
        Ivy_DecClear( &Node );
        Node.Type = IVY_DEC_BUF;
        Node.fCompl = (RetValue & 1);
        Node.Fan0 = ((RetValue >> 1) << 1);
        Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    }
    else if ( RetValue & 1 )
    { // check if the topmost node has to be complemented
        Node = Ivy_IntToDec( Vec_IntPop(vTree) );
        assert( Node.fCompl == 0 );
        Node.fCompl = (RetValue & 1);
        Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    }
    if ( uTruth != Ivy_TruthDsdCompute(vTree) )
        printf( "Verification failed.\n" );
    return 1;
}